

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::DefaultCoverageBinInitializerSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,DefaultCoverageBinInitializerSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  size_t index_local;
  DefaultCoverageBinInitializerSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->defaultKeyword).kind;
    token._2_1_ = (this->defaultKeyword).field_0x2;
    token.numFlags.raw = (this->defaultKeyword).numFlags.raw;
    token.rawLen = (this->defaultKeyword).rawLen;
    token.info = (this->defaultKeyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->sequenceKeyword).kind;
    token_00._2_1_ = (this->sequenceKeyword).field_0x2;
    token_00.numFlags.raw = (this->sequenceKeyword).numFlags.raw;
    token_00.rawLen = (this->sequenceKeyword).rawLen;
    token_00.info = (this->sequenceKeyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax DefaultCoverageBinInitializerSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return defaultKeyword;
        case 1: return sequenceKeyword;
        default: return nullptr;
    }
}